

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::gil_scoped_release::gil_scoped_release(gil_scoped_release *this,bool disassoc)

{
  internals *piVar1;
  PyThreadState *pPVar2;
  undefined7 in_register_00000031;
  
  this->disassoc = disassoc;
  piVar1 = detail::get_internals();
  pPVar2 = (PyThreadState *)PyEval_SaveThread();
  this->tstate = pPVar2;
  if ((int)CONCAT71(in_register_00000031,disassoc) != 0) {
    PyThread_tss_set(piVar1->tstate,0);
    return;
  }
  return;
}

Assistant:

explicit gil_scoped_release(bool disassoc = false) : disassoc(disassoc) {
        // `get_internals()` must be called here unconditionally in order to initialize
        // `internals.tstate` for subsequent `gil_scoped_acquire` calls. Otherwise, an
        // initialization race could occur as multiple threads try `gil_scoped_acquire`.
        const auto &internals = detail::get_internals();
        tstate = PyEval_SaveThread();
        if (disassoc) {
            auto key = internals.tstate;
            PYBIND11_TLS_DELETE_VALUE(key);
        }
    }